

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Clip_x86_avx512::forward_inplace(Clip_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  int iVar9;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  __m128 _p_2;
  __m128 _max;
  __m128 _min;
  __m256 _p_1;
  __m256 _max_avx;
  __m256 _min_avx;
  __m512 _p;
  __m512 _max_avx512;
  __m512 _min_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  int local_610;
  undefined1 (*local_5b8) [64];
  int local_5ac;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  lVar8 = in_RSI[7];
  iVar9 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
          (int)in_RSI[3];
  for (local_5ac = 0; local_5ac < (int)lVar8; local_5ac = local_5ac + 1) {
    local_5b8 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_5ac * in_RSI[2]);
    local_610 = 0;
    auVar10 = vbroadcastss_avx512f
                        (ZEXT416(*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)));
    auVar11 = vbroadcastss_avx512f
                        (ZEXT416(*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)));
    for (; local_610 + 0xf < iVar9; local_610 = local_610 + 0x10) {
      auVar12 = vmaxps_avx512f(*local_5b8,auVar10);
      auVar12 = vminps_avx512f(auVar12,auVar11);
      local_700 = auVar12._0_8_;
      uStack_6f8 = auVar12._8_8_;
      uStack_6f0 = auVar12._16_8_;
      uStack_6e8 = auVar12._24_8_;
      uStack_6e0 = auVar12._32_8_;
      uStack_6d8 = auVar12._40_8_;
      uStack_6d0 = auVar12._48_8_;
      uStack_6c8 = auVar12._56_8_;
      *(undefined8 *)*local_5b8 = local_700;
      *(undefined8 *)(*local_5b8 + 8) = uStack_6f8;
      *(undefined8 *)(*local_5b8 + 0x10) = uStack_6f0;
      *(undefined8 *)(*local_5b8 + 0x18) = uStack_6e8;
      *(undefined8 *)(*local_5b8 + 0x20) = uStack_6e0;
      *(undefined8 *)(*local_5b8 + 0x28) = uStack_6d8;
      *(undefined8 *)(*local_5b8 + 0x30) = uStack_6d0;
      *(undefined8 *)(*local_5b8 + 0x38) = uStack_6c8;
      local_5b8 = local_5b8 + 1;
    }
    uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
    auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
    uStack_d0 = auVar4._0_8_;
    uStack_c8 = auVar4._8_8_;
    uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
    auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
    uStack_90 = auVar4._0_8_;
    uStack_88 = auVar4._8_8_;
    for (; local_610 + 7 < iVar9; local_610 = local_610 + 8) {
      auVar6._16_8_ = uStack_d0;
      auVar6._0_16_ = auVar3;
      auVar6._24_8_ = uStack_c8;
      auVar6 = vmaxps_avx(*(undefined1 (*) [32])*local_5b8,auVar6);
      auVar7._16_8_ = uStack_90;
      auVar7._0_16_ = auVar5;
      auVar7._24_8_ = uStack_88;
      auVar6 = vminps_avx(auVar6,auVar7);
      local_760 = auVar6._0_8_;
      uStack_758 = auVar6._8_8_;
      uStack_750 = auVar6._16_8_;
      uStack_748 = auVar6._24_8_;
      *(undefined8 *)*local_5b8 = local_760;
      *(undefined8 *)(*local_5b8 + 8) = uStack_758;
      *(undefined8 *)(*local_5b8 + 0x10) = uStack_750;
      *(undefined8 *)(*local_5b8 + 0x18) = uStack_748;
      local_5b8 = (undefined1 (*) [64])(*local_5b8 + 0x20);
    }
    uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar3._4_4_ = uVar2;
    auVar3._0_4_ = uVar2;
    auVar3._12_4_ = uVar2;
    auVar3._8_4_ = uVar2;
    uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    auVar4._4_4_ = uVar2;
    auVar4._0_4_ = uVar2;
    auVar4._12_4_ = uVar2;
    auVar4._8_4_ = uVar2;
    for (; local_610 + 3 < iVar9; local_610 = local_610 + 4) {
      auVar5 = vmaxps_avx(*(undefined1 (*) [16])*local_5b8,auVar3);
      auVar5 = vminps_avx(auVar5,auVar4);
      local_790 = auVar5._0_8_;
      uStack_788 = auVar5._8_8_;
      *(undefined8 *)*local_5b8 = local_790;
      *(undefined8 *)(*local_5b8 + 8) = uStack_788;
      local_5b8 = (undefined1 (*) [64])(*local_5b8 + 0x10);
    }
    for (; local_610 < iVar9; local_610 = local_610 + 1) {
      if (*(float *)*local_5b8 < *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)) {
        *(undefined4 *)*local_5b8 =
             *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      }
      if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) < *(float *)*local_5b8) {
        *(undefined4 *)*local_5b8 =
             *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      }
      local_5b8 = (undefined1 (*) [64])(*local_5b8 + 4);
    }
  }
  return 0;
}

Assistant:

int Clip_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}